

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_udp_ref2(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  sockaddr_in addr;
  uv_udp_t h;
  undefined1 auStack_338 [16];
  undefined1 auStack_328 [16];
  undefined1 auStack_318 [216];
  undefined1 auStack_240 [320];
  code *pcStack_100;
  undefined1 local_f0 [16];
  undefined1 local_e0 [216];
  
  pcStack_100 = (code *)0x169ac7;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_f0);
  if (iVar1 == 0) {
    pcStack_100 = (code *)0x169ad4;
    uVar2 = uv_default_loop();
    pcStack_100 = (code *)0x169ae4;
    uv_udp_init(uVar2,local_e0);
    pcStack_100 = (code *)0x169af3;
    uv_udp_bind(local_e0,local_f0,0);
    pcStack_100 = (code *)0x169b05;
    uv_udp_recv_start(local_e0,fail_cb);
    pcStack_100 = (code *)0x169b0d;
    uv_unref(local_e0);
    pcStack_100 = (code *)0x169b12;
    uVar2 = uv_default_loop();
    pcStack_100 = (code *)0x169b1c;
    uv_run(uVar2,0);
    pcStack_100 = (code *)0x169b24;
    do_close(local_e0);
    pcStack_100 = (code *)0x169b29;
    unaff_RBX = uv_default_loop();
    pcStack_100 = (code *)0x169b3d;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_100 = (code *)0x169b47;
    uv_run(unaff_RBX,0);
    pcStack_100 = (code *)0x169b4c;
    uVar2 = uv_default_loop();
    pcStack_100 = (code *)0x169b54;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_100 = (code *)0x169b68;
    run_test_udp_ref2_cold_1();
  }
  pcStack_100 = run_test_udp_ref3;
  run_test_udp_ref2_cold_2();
  pcStack_100 = (code *)unaff_RBX;
  auStack_338 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_328);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    uv_udp_init(uVar2,auStack_318);
    uv_udp_send(auStack_240,auStack_318,auStack_338,1,auStack_328,req_cb);
    uv_unref(auStack_318);
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (req_cb_called == 1) {
      do_close(auStack_318);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00169c5c;
    }
  }
  else {
    run_test_udp_ref3_cold_1();
  }
  run_test_udp_ref3_cold_2();
LAB_00169c5c:
  run_test_udp_ref3_cold_3();
  req_cb_called = req_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(udp_ref2) {
  struct sockaddr_in addr;
  uv_udp_t h;
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_udp_init(uv_default_loop(), &h);
  uv_udp_bind(&h, (const struct sockaddr*) &addr, 0);
  uv_udp_recv_start(&h, (uv_alloc_cb)fail_cb, (uv_udp_recv_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}